

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O0

void __thiscall ManifestFile::ParseCommon(ManifestFile *this,Value *root_node)

{
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *this_00;
  bool bVar1;
  Value *pVVar2;
  reference pVVar3;
  const_iterator cVar4;
  undefined1 local_1b0 [8];
  string new_name;
  undefined1 local_168 [8];
  string original_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator local_d9;
  string local_d8;
  _Base_ptr local_b8;
  undefined1 local_b0;
  SelfType local_a8;
  _Base_ptr local_98;
  undefined1 local_90;
  undefined1 local_88 [8];
  ValueConstIterator func_it;
  Value *funcs_renamed;
  Value *ext;
  undefined1 local_58 [8];
  const_iterator __end2;
  undefined1 local_38 [8];
  const_iterator __begin2;
  Value *__range2;
  Value *inst_exts;
  Value *root_node_local;
  ManifestFile *this_local;
  
  pVVar2 = Json::Value::operator[](root_node,"instance_extensions");
  bVar1 = Json::Value::isNull(pVVar2);
  if ((!bVar1) && (bVar1 = Json::Value::isArray(pVVar2), bVar1)) {
    __begin2.super_ValueIteratorBase._8_8_ = pVVar2;
    cVar4 = Json::Value::begin(pVVar2);
    __end2.super_ValueIteratorBase._8_8_ = cVar4.super_ValueIteratorBase.current_._M_node;
    __begin2.super_ValueIteratorBase.current_._M_node._0_1_ = cVar4.super_ValueIteratorBase.isNull_;
    local_38 = (undefined1  [8])__end2.super_ValueIteratorBase._8_8_;
    cVar4 = Json::Value::end((Value *)__begin2.super_ValueIteratorBase._8_8_);
    local_58 = (undefined1  [8])cVar4.super_ValueIteratorBase.current_._M_node;
    __end2.super_ValueIteratorBase.current_._M_node._0_1_ = cVar4.super_ValueIteratorBase.isNull_;
    while (bVar1 = Json::ValueIteratorBase::operator!=
                             ((ValueIteratorBase *)local_38,(SelfType *)local_58), bVar1) {
      pVVar3 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_38);
      ParseExtension(pVVar3,&this->_instance_extensions);
      Json::ValueConstIterator::operator++((ValueConstIterator *)local_38);
    }
  }
  func_it.super_ValueIteratorBase._8_8_ = Json::Value::operator[](root_node,"functions");
  bVar1 = Json::Value::isNull((Value *)func_it.super_ValueIteratorBase._8_8_);
  if ((!bVar1) &&
     (bVar1 = Json::Value::empty((Value *)func_it.super_ValueIteratorBase._8_8_), !bVar1)) {
    cVar4 = Json::Value::begin((Value *)func_it.super_ValueIteratorBase._8_8_);
    local_98 = (_Base_ptr)cVar4.super_ValueIteratorBase.current_._M_node;
    local_90 = cVar4.super_ValueIteratorBase.isNull_;
    local_88 = (undefined1  [8])local_98;
    func_it.super_ValueIteratorBase.current_._M_node._0_1_ = local_90;
    while( true ) {
      cVar4 = Json::Value::end((Value *)func_it.super_ValueIteratorBase._8_8_);
      local_b8 = (_Base_ptr)cVar4.super_ValueIteratorBase.current_._M_node;
      local_b0 = cVar4.super_ValueIteratorBase.isNull_;
      local_a8.current_._M_node = local_b8;
      local_a8.isNull_ = (bool)local_b0;
      bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_88,&local_a8);
      if (!bVar1) break;
      pVVar3 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_88);
      bVar1 = Json::Value::isString(pVVar3);
      if (bVar1) {
        pVVar2 = (Value *)((long)&new_name.field_2 + 8);
        Json::ValueIteratorBase::key(pVVar2,(ValueIteratorBase *)local_88);
        Json::Value::asString_abi_cxx11_((String *)local_168,pVVar2);
        Json::Value::~Value((Value *)((long)&new_name.field_2 + 8));
        pVVar3 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_88);
        Json::Value::asString_abi_cxx11_((String *)local_1b0,pVVar3);
        std::
        unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<std::__cxx11::string&,std::__cxx11::string&>
                  ((unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&this->_functions_renamed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        std::__cxx11::string::~string((string *)local_168);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d8,"",&local_d9);
        std::operator+(&local_130,"ManifestFile::ParseCommon ",&this->_filename);
        std::operator+(&local_110,&local_130," \"functions\" section contains non-string values.");
        original_name.field_2._8_8_ = 0;
        this_00 = (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                  ((long)&original_name.field_2 + 8);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(this_00);
        LoaderLogger::LogWarningMessage(&local_d8,&local_110,this_00);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                   ((long)&original_name.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      }
      Json::ValueConstIterator::operator++((ValueConstIterator *)local_88);
    }
  }
  return;
}

Assistant:

void ManifestFile::ParseCommon(Json::Value const &root_node) {
    const Json::Value &inst_exts = root_node["instance_extensions"];
    if (!inst_exts.isNull() && inst_exts.isArray()) {
        for (const auto &ext : inst_exts) {
            ParseExtension(ext, _instance_extensions);
        }
    }
    const Json::Value &funcs_renamed = root_node["functions"];
    if (!funcs_renamed.isNull() && !funcs_renamed.empty()) {
        for (Json::ValueConstIterator func_it = funcs_renamed.begin(); func_it != funcs_renamed.end(); ++func_it) {
            if (!(*func_it).isString()) {
                LoaderLogger::LogWarningMessage(
                    "", "ManifestFile::ParseCommon " + _filename + " \"functions\" section contains non-string values.");
                continue;
            }
            std::string original_name = func_it.key().asString();
            std::string new_name = (*func_it).asString();
            _functions_renamed.emplace(original_name, new_name);
        }
    }
}